

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

MinMax<signed_char> Omega_h::get_minmax<signed_char>(CommPtr *comm,Read<signed_char> *a)

{
  char cVar1;
  Read<signed_char> local_70;
  shared_ptr<Omega_h::Comm> local_60 [2];
  Read<signed_char> local_40;
  shared_ptr<Omega_h::Comm> local_30;
  Read<signed_char> *local_20;
  Read<signed_char> *a_local;
  CommPtr *comm_local;
  
  local_20 = a;
  a_local = (Read<signed_char> *)comm;
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_30,comm);
  Read<signed_char>::Read(&local_40,a);
  cVar1 = get_min<signed_char>(&local_30,&local_40);
  comm_local._6_1_ = cVar1;
  std::shared_ptr<Omega_h::Comm>::shared_ptr(local_60,comm);
  Read<signed_char>::Read(&local_70,a);
  cVar1 = get_max<signed_char>(local_60,&local_70);
  comm_local._7_1_ = cVar1;
  Read<signed_char>::~Read(&local_70);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(local_60);
  Read<signed_char>::~Read(&local_40);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_30);
  return comm_local._6_2_;
}

Assistant:

MinMax<T> get_minmax(CommPtr comm, Read<T> a) {
  return {get_min(comm, a), get_max(comm, a)};
}